

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSeq.c
# Opt level: O1

Vec_Ptr_t * Sim_SimulateSeqModel(Abc_Ntk_t *pNtk,int nFrames,int *pModel)

{
  void **ppvVar1;
  void **ppvVar2;
  void *pvVar3;
  uint *puVar4;
  int iVar5;
  uint uVar6;
  Vec_Ptr_t *vInfo;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  
  vInfo = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,nFrames,0);
  pAVar7 = Abc_AigConst1(pNtk);
  Sim_UtilSetConst((uint *)vInfo->pArray[pAVar7->Id],nFrames,1);
  pVVar8 = pNtk->vPis;
  if (0 < pVVar8->nSize) {
    ppvVar1 = pVVar8->pArray;
    ppvVar2 = vInfo->pArray;
    lVar10 = 0;
    do {
      if (0 < nFrames) {
        pvVar3 = ppvVar2[*(int *)((long)ppvVar1[lVar10] + 0x10)];
        uVar11 = 0;
        do {
          *(uint *)((long)pvVar3 + uVar11 * 4) =
               -(uint)(pModel[pVVar8->nSize * (int)uVar11 + (int)lVar10] != 0);
          uVar11 = uVar11 + 1;
        } while ((uint)nFrames != uVar11);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vBoxes;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      pvVar3 = pVVar8->pArray[lVar10];
      if ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 8) {
        puVar4 = (uint *)vInfo->pArray[*(int *)((long)pvVar3 + 0x10)];
        if (*(long *)((long)pvVar3 + 0x38) == 1) {
          uVar6 = 0;
        }
        else if (*(long *)((long)pvVar3 + 0x38) == 2) {
          uVar6 = 0xffffffff;
        }
        else {
          iVar9 = rand();
          iVar5 = rand();
          uVar6 = rand();
          uVar6 = uVar6 ^ iVar5 << 0xc ^ iVar9 << 0x18;
        }
        *puVar4 = uVar6;
      }
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vBoxes;
    } while (lVar10 < pVVar8->nSize);
  }
  if (0 < nFrames) {
    iVar9 = 0;
    do {
      Sim_SimulateSeqFrame(vInfo,pNtk,iVar9,1,(uint)(iVar9 < nFrames + -1));
      iVar9 = iVar9 + 1;
    } while (nFrames != iVar9);
  }
  return vInfo;
}

Assistant:

Vec_Ptr_t * Sim_SimulateSeqModel( Abc_Ntk_t * pNtk, int nFrames, int * pModel )
{
    Vec_Ptr_t * vInfo;
    Abc_Obj_t * pNode;
    unsigned * pUnsigned;
    int i, k;
    vInfo = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), nFrames, 0 );
    // set the constant data
    pNode = Abc_AigConst1(pNtk);
    Sim_UtilSetConst( Sim_SimInfoGet(vInfo,pNode), nFrames, 1 );
    // set the random PI data
    Abc_NtkForEachPi( pNtk, pNode, i )
    {
        pUnsigned = Sim_SimInfoGet(vInfo,pNode);
        for ( k = 0; k < nFrames; k++ )
            pUnsigned[k] = pModel[k * Abc_NtkPiNum(pNtk) + i] ? ~((unsigned)0) : 0;
    }
    // set the initial state data
    Abc_NtkForEachLatch( pNtk, pNode, i )
    {
        pUnsigned = Sim_SimInfoGet(vInfo,pNode);
        if ( Abc_LatchIsInit0(pNode) )
            pUnsigned[0] = 0;
        else if ( Abc_LatchIsInit1(pNode) )
            pUnsigned[0] = ~((unsigned)0);
        else 
            pUnsigned[0] = SIM_RANDOM_UNSIGNED;
    }
    // simulate the nodes for the given number of timeframes
    for ( i = 0; i < nFrames; i++ )
        Sim_SimulateSeqFrame( vInfo, pNtk, i, 1, (int)(i < nFrames-1) );
/*
    // print the simulated values
    for ( i = 0; i < nFrames; i++ )
    {
        printf( "Frame %d : ", i+1 );
        Abc_NtkForEachPi( pNtk, pNode, k )
            printf( "%d", Sim_SimInfoGet(vInfo,pNode)[i] > 0 );
        printf( " " );
        Abc_NtkForEachLatch( pNtk, pNode, k )
            printf( "%d", Sim_SimInfoGet(vInfo,pNode)[i] > 0 );
        printf( " " );
        Abc_NtkForEachPo( pNtk, pNode, k )
            printf( "%d", Sim_SimInfoGet(vInfo,pNode)[i] > 0 );
        printf( "\n" );
    }
    printf( "\n" );
*/
    return vInfo;
}